

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode Curl_mime_duppart(curl_mimepart *dst,curl_mimepart *src)

{
  CURLcode CVar1;
  CURLcode CVar2;
  curl_mime *subparts;
  curl_mimepart *dst_00;
  curl_slist *headers;
  char *pcVar3;
  curl_mimepart *src_00;
  
  switch(src->kind) {
  case MIMEKIND_DATA:
    CVar1 = curl_mime_data(dst,src->data,src->datasize);
    goto LAB_004a93a9;
  case MIMEKIND_FILE:
    CVar1 = curl_mime_filedata(dst,src->data);
    if (CVar1 != CURLE_READ_ERROR) goto LAB_004a93a9;
  case MIMEKIND_NONE:
switchD_004a92f3_caseD_0:
    CVar1 = CURLE_OK;
    if (src->userheaders != (curl_slist *)0x0) {
      headers = Curl_slist_duplicate(src->userheaders);
      if (headers == (curl_slist *)0x0) {
LAB_004a93f0:
        CVar1 = CURLE_OUT_OF_MEMORY;
      }
      else {
        CVar2 = curl_mime_headers(dst,headers,1);
        if (CVar2 != CURLE_OK) {
          curl_slist_free_all(headers);
          CVar1 = CVar2;
        }
      }
    }
    break;
  case MIMEKIND_CALLBACK:
    CVar1 = curl_mime_data_cb(dst,src->datasize,src->readfunc,src->seekfunc,src->freefunc,src->arg);
LAB_004a93a9:
    if (CVar1 == CURLE_OK) goto switchD_004a92f3_caseD_0;
    break;
  case MIMEKIND_MULTIPART:
    subparts = curl_mime_init(dst->easy);
    if (subparts != (curl_mime *)0x0) {
      CVar1 = Curl_mime_set_subparts(dst,subparts,1);
      src_00 = *(curl_mimepart **)((long)src->arg + 0x10);
      if (src_00 != (curl_mimepart *)0x0 && CVar1 == CURLE_OK) {
        do {
          dst_00 = curl_mime_addpart(subparts);
          if (dst_00 == (curl_mimepart *)0x0) goto LAB_004a93f0;
          CVar1 = Curl_mime_duppart(dst_00,src_00);
        } while ((CVar1 == CURLE_OK) && (src_00 = src_00->nextpart, src_00 != (curl_mimepart *)0x0))
        ;
      }
      goto LAB_004a93a9;
    }
    dst->encoder = src->encoder;
    goto LAB_004a94be;
  default:
    CVar1 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  if (dst == (curl_mimepart *)0x0) {
    return CURLE_WRITE_ERROR;
  }
  dst->encoder = src->encoder;
  if (CVar1 != CURLE_OK) goto LAB_004a94c3;
  pcVar3 = src->mimetype;
  (*Curl_cfree)(dst->mimetype);
  dst->mimetype = (char *)0x0;
  if (pcVar3 == (char *)0x0) {
LAB_004a9449:
    pcVar3 = src->name;
    (*Curl_cfree)(dst->name);
    dst->name = (char *)0x0;
    if (pcVar3 != (char *)0x0) {
      pcVar3 = (*Curl_cstrdup)(pcVar3);
      dst->name = pcVar3;
      if (pcVar3 == (char *)0x0) goto LAB_004a94be;
    }
    pcVar3 = src->filename;
    (*Curl_cfree)(dst->filename);
    dst->filename = (char *)0x0;
    if (pcVar3 == (char *)0x0) {
      return CURLE_OK;
    }
    pcVar3 = (*Curl_cstrdup)(pcVar3);
    dst->filename = pcVar3;
    if (pcVar3 != (char *)0x0) {
      return CURLE_OK;
    }
  }
  else {
    pcVar3 = (*Curl_cstrdup)(pcVar3);
    dst->mimetype = pcVar3;
    if (pcVar3 != (char *)0x0) goto LAB_004a9449;
  }
LAB_004a94be:
  CVar1 = CURLE_OUT_OF_MEMORY;
LAB_004a94c3:
  Curl_mime_cleanpart(dst);
  return CVar1;
}

Assistant:

CURLcode Curl_mime_duppart(curl_mimepart *dst, const curl_mimepart *src)
{
  curl_mime *mime;
  curl_mimepart *d;
  const curl_mimepart *s;
  CURLcode res = CURLE_OK;

  /* Duplicate content. */
  switch(src->kind) {
  case MIMEKIND_NONE:
    break;
  case MIMEKIND_DATA:
    res = curl_mime_data(dst, src->data, (size_t) src->datasize);
    break;
  case MIMEKIND_FILE:
    res = curl_mime_filedata(dst, src->data);
    /* Do not abort duplication if file is not readable. */
    if(res == CURLE_READ_ERROR)
      res = CURLE_OK;
    break;
  case MIMEKIND_CALLBACK:
    res = curl_mime_data_cb(dst, src->datasize, src->readfunc,
                            src->seekfunc, src->freefunc, src->arg);
    break;
  case MIMEKIND_MULTIPART:
    /* No one knows about the cloned subparts, thus always attach ownership
       to the part. */
    mime = curl_mime_init(dst->easy);
    res = mime? curl_mime_subparts(dst, mime): CURLE_OUT_OF_MEMORY;

    /* Duplicate subparts. */
    for(s = ((curl_mime *) src->arg)->firstpart; !res && s; s = s->nextpart) {
      d = curl_mime_addpart(mime);
      res = d? Curl_mime_duppart(d, s): CURLE_OUT_OF_MEMORY;
    }
    break;
  default:  /* Invalid kind: should not occur. */
    res = CURLE_BAD_FUNCTION_ARGUMENT;  /* Internal error? */
    break;
  }

  /* Duplicate headers. */
  if(!res && src->userheaders) {
    struct curl_slist *hdrs = Curl_slist_duplicate(src->userheaders);

    if(!hdrs)
      res = CURLE_OUT_OF_MEMORY;
    else {
      /* No one but this procedure knows about the new header list,
         so always take ownership. */
      res = curl_mime_headers(dst, hdrs, TRUE);
      if(res)
        curl_slist_free_all(hdrs);
    }
  }

  /* Duplicate other fields. */
  if(dst != NULL)
    dst->encoder = src->encoder;
  else
    res = CURLE_WRITE_ERROR;
  if(!res)
    res = curl_mime_type(dst, src->mimetype);
  if(!res)
    res = curl_mime_name(dst, src->name);
  if(!res)
    res = curl_mime_filename(dst, src->filename);

  /* If an error occurred, rollback. */
  if(res && dst)
    Curl_mime_cleanpart(dst);

  return res;
}